

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O3

void x86_64_branch_link(dill_stream s)

{
  int iVar1;
  private_ctx pdVar2;
  branch_location *pbVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  
  pdVar2 = s->p;
  if (0 < (pdVar2->branch_table).branch_count) {
    lVar5 = 0;
    do {
      pbVar3 = (pdVar2->branch_table).branch_locs;
      iVar1 = pbVar3[lVar5].loc;
      pcVar4 = s->p->code_base;
      bVar6 = pcVar4[iVar1] == '\x0f';
      *(uint *)(pcVar4 + (ulong)bVar6 + 1 + (long)iVar1) =
           (bVar6 ^ 0xfffffffb) + ((pdVar2->branch_table).label_locs[pbVar3[lVar5].label] - iVar1);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pdVar2->branch_table).branch_count);
  }
  return;
}

Assistant:

static void
x86_64_branch_link(dill_stream s)
{
    struct branch_table* t = &s->p->branch_table;
    int i;

    for (i = 0; i < t->branch_count; i++) {
        int label = t->branch_locs[i].label;
        int label_offset = t->label_locs[label] - t->branch_locs[i].loc;
        char* branch_addr =
            (char*)((char*)s->p->code_base + t->branch_locs[i].loc);
        int offset;
        if (*branch_addr == 0x0f) {
            branch_addr += 2; /* conditional */
            offset = 6;
        } else {
            branch_addr++; /* unconditional */
            offset = 5;
        }
        int tmp = label_offset - offset;
        memcpy(branch_addr, &tmp, 4);
    }
}